

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O0

_Bool do_v7m_function_return(ARMCPU_conflict1 *cpu)

{
  uint uVar1;
  _Bool _Var2;
  ARMMMUIdx mmu_idx_00;
  uint idx;
  TCGMemOpIdx oi_00;
  CPUARMState_conflict *env_00;
  uint32_t *puVar3;
  tcg_target_ulong tVar4;
  tcg_target_ulong tVar5;
  uint32_t frameptr;
  uint32_t *frame_sp_p;
  ARMMMUIdx mmu_idx;
  TCGMemOpIdx oi;
  _Bool spsel;
  _Bool threadmode;
  uint32_t newpsr_exc;
  uint32_t newpsr;
  uint32_t newpc;
  CPUARMState_conflict *env;
  ARMCPU_conflict1 *cpu_local;
  
  env_00 = &cpu->env;
  _Var2 = arm_v7m_is_handler_mode(env_00);
  puVar3 = get_v7m_sp_ptr(env_00,true,(_Bool)((_Var2 ^ 0xffU) & 1),
                          ((cpu->env).v7m.control[1] & 2) != 0);
  uVar1 = *puVar3;
  mmu_idx_00 = arm_v7m_mmu_idx_for_secstate_aarch64(env_00,true);
  idx = arm_to_core_mmu_idx(mmu_idx_00);
  oi_00 = make_memop_idx(MO_8,idx);
  tVar4 = helper_le_ldul_mmu_aarch64(env_00,(ulong)uVar1,oi_00,0);
  tVar5 = helper_le_ldul_mmu_aarch64(env_00,(ulong)(uVar1 + 4),oi_00,0);
  if ((((cpu->env).v7m.exception == 0) && ((tVar5 & 0x1ff) == 0)) ||
     (((cpu->env).v7m.exception == 1 && ((tVar5 & 0x1ff) != 0)))) {
    *puVar3 = uVar1 + 8;
    switch_v7m_security_state(env_00,true);
    (cpu->env).v7m.exception = (uint)tVar5 & 0x1ff;
    (cpu->env).v7m.control[1] = (cpu->env).v7m.control[1] & 0xfffffff7;
    if ((tVar5 & 0x100000) != 0) {
      (cpu->env).v7m.control[1] = (cpu->env).v7m.control[1] | 8;
    }
    xpsr_write(env_00,0,0x600fc00);
    (cpu->env).thumb = (uint)tVar4 & 1;
    (cpu->env).regs[0xf] = (uint)tVar4 & 0xfffffffe;
    arm_rebuild_hflags_aarch64(env_00);
    cpu_local._7_1_ = true;
  }
  else {
    uVar1 = (cpu->env).v7m.secure;
    (cpu->env).v7m.cfsr[uVar1] = (cpu->env).v7m.cfsr[uVar1] | 0x40000;
    armv7m_nvic_set_pending_aarch64((cpu->env).nvic,6,(cpu->env).v7m.secure != 0);
    cpu_local._7_1_ = false;
  }
  return cpu_local._7_1_;
}

Assistant:

static bool do_v7m_function_return(ARMCPU *cpu)
{
    /*
     * v8M security extensions magic function return.
     * We may either:
     *  (1) throw an exception (longjump)
     *  (2) return true if we successfully handled the function return
     *  (3) return false if we failed a consistency check and have
     *      pended a UsageFault that needs to be taken now
     *
     * At this point the magic return value is split between env->regs[15]
     * and env->thumb. We don't bother to reconstitute it because we don't
     * need it (all values are handled the same way).
     */
    CPUARMState *env = &cpu->env;
    uint32_t newpc, newpsr, newpsr_exc;

    qemu_log_mask(CPU_LOG_INT, "...really v7M secure function return\n");

    {
        bool threadmode, spsel;
        TCGMemOpIdx oi;
        ARMMMUIdx mmu_idx;
        uint32_t *frame_sp_p;
        uint32_t frameptr;

        /* Pull the return address and IPSR from the Secure stack */
        threadmode = !arm_v7m_is_handler_mode(env);
        spsel = env->v7m.control[M_REG_S] & R_V7M_CONTROL_SPSEL_MASK;

        frame_sp_p = get_v7m_sp_ptr(env, true, threadmode, spsel);
        frameptr = *frame_sp_p;

        /*
         * These loads may throw an exception (for MPU faults). We want to
         * do them as secure, so work out what MMU index that is.
         */
        mmu_idx = arm_v7m_mmu_idx_for_secstate(env, true);
        oi = make_memop_idx(MO_LE, arm_to_core_mmu_idx(mmu_idx));
        newpc = helper_le_ldul_mmu(env, frameptr, oi, 0);
        newpsr = helper_le_ldul_mmu(env, frameptr + 4, oi, 0);

        /* Consistency checks on new IPSR */
        newpsr_exc = newpsr & XPSR_EXCP;
        if (!((env->v7m.exception == 0 && newpsr_exc == 0) ||
              (env->v7m.exception == 1 && newpsr_exc != 0))) {
            /* Pend the fault and tell our caller to take it */
            env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_INVPC_MASK;
            armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE,
                                    env->v7m.secure);
            qemu_log_mask(CPU_LOG_INT,
                          "...taking INVPC UsageFault: "
                          "IPSR consistency check failed\n");
            return false;
        }

        *frame_sp_p = frameptr + 8;
    }

    /* This invalidates frame_sp_p */
    switch_v7m_security_state(env, true);
    env->v7m.exception = newpsr_exc;
    env->v7m.control[M_REG_S] &= ~R_V7M_CONTROL_SFPA_MASK;
    if (newpsr & XPSR_SFPA) {
        env->v7m.control[M_REG_S] |= R_V7M_CONTROL_SFPA_MASK;
    }
    xpsr_write(env, 0, XPSR_IT);
    env->thumb = newpc & 1;
    env->regs[15] = newpc & ~1;
    arm_rebuild_hflags(env);

    qemu_log_mask(CPU_LOG_INT, "...function return successful\n");
    return true;
}